

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message_type.cpp
# Opt level: O3

void __thiscall
BrokerMessageType_EmptyString_Test::~BrokerMessageType_EmptyString_Test
          (BrokerMessageType_EmptyString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BrokerMessageType, EmptyString) {
    std::uint32_t const mid = 1234;
    std::uint16_t const part = 21;
    std::uint16_t const num_parts = 1234;

    pstore::brokerface::message_type const actual{mid, part, num_parts, ""};

    EXPECT_EQ (actual.sender_id, pstore::brokerface::message_type::process_id);
    EXPECT_EQ (actual.message_id, mid);
    EXPECT_EQ (actual.part_no, part);
    EXPECT_EQ (actual.num_parts, num_parts);

    pstore::brokerface::message_type::payload_type expected_payload{{'\0'}};
    EXPECT_THAT (actual.payload, ::testing::ContainerEq (expected_payload));
}